

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

String * Directory::getTempDirectory(void)

{
  String *in_RDI;
  
  in_RDI->data = &in_RDI->_data;
  (in_RDI->_data).ref = 0;
  (in_RDI->_data).str = "/tmp";
  (in_RDI->_data).len = 4;
  return in_RDI;
}

Assistant:

String Directory::getTempDirectory()
{
#ifdef _WIN32
  char buffer[MAX_PATH + 2];
  DWORD len = GetTempPath(MAX_PATH + 2, buffer);
  if(len == 0)
    return String();
  while(len > 1 && buffer[len - 1] == '\\')
    --len;
  return String(buffer, len);
#else
  return String("/tmp");
#endif
}